

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall gl4cts::TextureFilterMinmaxUtils::Texture2D::Texture2D(Texture2D *this)

{
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"vec2",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"sampler2D",&local_4a);
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0xde1,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_01dda188;
  (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.m_data.ptr
       = (Texture2D *)0x0;
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture2D::Texture2D() : SupportedTextureType(GL_TEXTURE_2D, "vec2", "sampler2D")
{
}